

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  undefined4 uVar2;
  vfloat<4> vVar3;
  uint uVar4;
  BVH *bvh;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  GridSOA *pGVar29;
  bool bVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  undefined8 uVar34;
  size_t sVar35;
  undefined4 uVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  NodeRef root;
  size_t sVar41;
  ulong uVar42;
  long lVar43;
  uint uVar44;
  long lVar45;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar46;
  NodeRef *pNVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar168;
  float fVar176;
  float fVar177;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar178;
  undefined1 auVar175 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar183;
  float fVar188;
  float fVar189;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar190;
  undefined1 auVar187 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [64];
  float fVar199;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar200 [64];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 local_1b28 [16];
  RayK<4> *local_1b10;
  GridSOA *local_1b08;
  undefined4 local_1afc;
  undefined1 local_1af8 [16];
  undefined1 local_1ae8 [16];
  vbool<4> terminated;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_1a58 [8];
  float fStack_1a50;
  float fStack_1a4c;
  float local_1a18;
  float fStack_1a14;
  float fStack_1a10;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined4 local_1938;
  undefined4 uStack_1934;
  undefined4 uStack_1930;
  undefined4 uStack_192c;
  undefined1 local_1928 [16];
  uint local_1918;
  uint uStack_1914;
  uint uStack_1910;
  uint uStack_190c;
  uint uStack_1908;
  uint uStack_1904;
  uint uStack_1900;
  uint uStack_18fc;
  TravRayK<4,_true> tray;
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [8];
  float fStack_17a0;
  float fStack_179c;
  undefined1 local_1798 [8];
  float fStack_1790;
  float fStack_178c;
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [8];
  float fStack_1730;
  float fStack_172c;
  undefined1 local_1728 [8];
  float fStack_1720;
  float fStack_171c;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar28 = mm_lookupmask_ps._8_8_;
  uVar27 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar84 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar57 = vpcmpeqd_avx(auVar84,(undefined1  [16])valid_i->field_0);
    auVar58 = ZEXT816(0) << 0x40;
    auVar11 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar58,5);
    auVar132 = auVar57 & auVar11;
    if ((((auVar132 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar132 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar132 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar132[0xf] < '\0'
       ) {
      auVar11 = vandps_avx(auVar11,auVar57);
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar191._8_4_ = 0x7fffffff;
      auVar191._0_8_ = 0x7fffffff7fffffff;
      auVar191._12_4_ = 0x7fffffff;
      auVar57 = vandps_avx(auVar191,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar179._8_4_ = 0x219392ef;
      auVar179._0_8_ = 0x219392ef219392ef;
      auVar179._12_4_ = 0x219392ef;
      auVar132 = vcmpps_avx(auVar57,auVar179,1);
      auVar193._8_4_ = 0x3f800000;
      auVar193._0_8_ = 0x3f8000003f800000;
      auVar193._12_4_ = 0x3f800000;
      auVar91 = vdivps_avx(auVar193,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar57 = vandps_avx(auVar191,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar134 = vcmpps_avx(auVar57,auVar179,1);
      auVar146 = vdivps_avx(auVar193,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar57 = vandps_avx(auVar191,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar57 = vcmpps_avx(auVar57,auVar179,1);
      auVar147 = vdivps_avx(auVar193,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar180._8_4_ = 0x5d5e0b6b;
      auVar180._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar180._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar91,auVar180,auVar132)
      ;
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar146,auVar180,auVar134);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar147,auVar180,auVar57)
      ;
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar58,1);
      auVar91._8_4_ = 0x10;
      auVar91._0_8_ = 0x1000000010;
      auVar91._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar57,auVar91);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar58,5);
      auVar132._8_4_ = 0x20;
      auVar132._0_8_ = 0x2000000020;
      auVar132._12_4_ = 0x20;
      auVar146._8_4_ = 0x30;
      auVar146._0_8_ = 0x3000000030;
      auVar146._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar146,auVar132,auVar57);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar58,5);
      auVar134._8_4_ = 0x40;
      auVar134._0_8_ = 0x4000000040;
      auVar134._12_4_ = 0x40;
      auVar147._8_4_ = 0x50;
      auVar147._0_8_ = 0x5000000050;
      auVar147._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar147,auVar134,auVar57);
      auVar57 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar58);
      auVar132 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar58);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar196 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar57,auVar11);
      auVar57._8_4_ = 0xff800000;
      auVar57._0_8_ = 0xff800000ff800000;
      auVar57._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar57,auVar132,auVar11);
      terminated.field_0.i[1] = auVar11._4_4_ ^ auVar84._4_4_;
      terminated.field_0.i[0] = auVar11._0_4_ ^ auVar84._0_4_;
      terminated.field_0.i[2] = auVar11._8_4_ ^ auVar84._8_4_;
      terminated.field_0.i[3] = auVar11._12_4_ ^ auVar84._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar44 = 3;
      }
      else {
        uVar44 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1b10 = ray + 0x80;
      pNVar47 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar46 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar198 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar200 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_019c5ead:
      do {
        do {
          root.ptr = pNVar47[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_019c747f;
          pNVar47 = pNVar47 + -1;
          paVar46 = paVar46 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar46->v;
          auVar88 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar84 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar31 = vmovmskps_avx(auVar84);
        } while (uVar31 == 0);
        uVar40 = (ulong)(uVar31 & 0xff);
        uVar31 = POPCOUNT(uVar31 & 0xff);
        if (uVar44 < uVar31) {
LAB_019c5eeb:
          do {
            pGVar29 = pre.super_Precalculations.grid;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_019c747f;
              auVar57 = auVar88._0_16_;
              auVar84 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar57,6);
              if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar84[0xf] < '\0') {
                if (((uint)root.ptr & 0xf) == 8) {
                  auVar84 = vpcmpeqd_avx(auVar84,auVar84);
                  auVar111 = ZEXT1664(auVar84 ^ (undefined1  [16])terminated.field_0);
                  uVar40 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                  uVar31 = *(uint *)(pre.super_Precalculations.grid + 0xc);
                  iVar32 = *(int *)(pre.super_Precalculations.grid + 0x10);
                  uVar38 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                  lVar37 = uVar38 + uVar40 * 0xc;
                  uVar42 = root.ptr >> 4;
                  lVar45 = (ulong)uVar31 * 4;
                  lVar20 = uVar42 * 4 + uVar38 + uVar40 * 8 + 0x30;
                  lVar23 = uVar42 * 4 + uVar38 + uVar40 * 4 + 0x30;
                  lVar33 = uVar38 + uVar42 * 4 + 0x30;
                  uVar34 = CONCAT71((int7)((ulong)lVar33 >> 8),1);
                  lVar43 = 0;
                  do {
                    local_1afc = (undefined4)uVar34;
                    lVar39 = (lVar43 + 1) * lVar45;
                    lVar19 = lVar39 + uVar42 * 4 + lVar37 + 0x2c;
                    lVar21 = lVar39 + lVar20;
                    lVar24 = lVar39 + lVar23;
                    lVar39 = lVar39 + uVar38 + 0x2c + uVar42 * 4;
                    lVar43 = lVar43 * lVar45;
                    lVar26 = lVar43 + uVar42 * 4 + lVar37 + 0x30;
                    lVar22 = lVar43 + lVar20;
                    lVar25 = lVar43 + lVar23;
                    local_1b08 = pGVar29 + lVar43 + lVar33;
                    lVar43 = 0;
                    do {
                      if ((ulong)((ulong)uVar31 != 2) * 4 + 4 == lVar43) break;
                      uVar36 = *(undefined4 *)(local_1b08 + lVar43 + -4);
                      auVar48._4_4_ = uVar36;
                      auVar48._0_4_ = uVar36;
                      auVar48._8_4_ = uVar36;
                      auVar48._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar25 + -4);
                      auVar71._4_4_ = uVar36;
                      auVar71._0_4_ = uVar36;
                      auVar71._8_4_ = uVar36;
                      auVar71._12_4_ = uVar36;
                      auVar91 = auVar111._0_16_;
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar22 + -4);
                      auVar92._4_4_ = uVar36;
                      auVar92._0_4_ = uVar36;
                      auVar92._8_4_ = uVar36;
                      auVar92._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar39);
                      auVar185._4_4_ = uVar36;
                      auVar185._0_4_ = uVar36;
                      auVar185._8_4_ = uVar36;
                      auVar185._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar24 + -4);
                      auVar113._4_4_ = uVar36;
                      auVar113._0_4_ = uVar36;
                      auVar113._8_4_ = uVar36;
                      auVar113._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar21 + -4);
                      auVar135._4_4_ = uVar36;
                      auVar135._0_4_ = uVar36;
                      auVar135._8_4_ = uVar36;
                      auVar135._12_4_ = uVar36;
                      auVar84 = *(undefined1 (*) [16])ray;
                      auVar57 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar132 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar146 = vsubps_avx(auVar48,auVar84);
                      auVar147 = vsubps_avx(auVar71,auVar57);
                      auVar179 = vsubps_avx(auVar92,auVar132);
                      auVar180 = vsubps_avx(auVar113,auVar57);
                      auVar193 = vsubps_avx(auVar135,auVar132);
                      auVar16 = vsubps_avx(auVar180,auVar147);
                      local_1af8 = vsubps_avx(auVar193,auVar179);
                      auVar114._0_4_ = auVar180._0_4_ + auVar147._0_4_;
                      auVar114._4_4_ = auVar180._4_4_ + auVar147._4_4_;
                      auVar114._8_4_ = auVar180._8_4_ + auVar147._8_4_;
                      auVar114._12_4_ = auVar180._12_4_ + auVar147._12_4_;
                      fVar7 = auVar179._0_4_;
                      auVar170._0_4_ = auVar193._0_4_ + fVar7;
                      fVar8 = auVar179._4_4_;
                      auVar170._4_4_ = auVar193._4_4_ + fVar8;
                      fVar9 = auVar179._8_4_;
                      auVar170._8_4_ = auVar193._8_4_ + fVar9;
                      fVar10 = auVar179._12_4_;
                      auVar170._12_4_ = auVar193._12_4_ + fVar10;
                      auVar197._0_4_ = auVar114._0_4_ * local_1af8._0_4_;
                      auVar197._4_4_ = auVar114._4_4_ * local_1af8._4_4_;
                      auVar197._8_4_ = auVar114._8_4_ * local_1af8._8_4_;
                      auVar197._12_4_ = auVar114._12_4_ * local_1af8._12_4_;
                      auVar66 = vfmsub231ps_fma(auVar197,auVar16,auVar170);
                      auVar17 = vsubps_avx(auVar185,auVar84);
                      auVar64 = vsubps_avx(auVar17,auVar146);
                      auVar186._0_4_ = auVar170._0_4_ * auVar64._0_4_;
                      auVar186._4_4_ = auVar170._4_4_ * auVar64._4_4_;
                      auVar186._8_4_ = auVar170._8_4_ * auVar64._8_4_;
                      auVar186._12_4_ = auVar170._12_4_ * auVar64._12_4_;
                      auVar171._0_4_ = auVar17._0_4_ + auVar146._0_4_;
                      auVar171._4_4_ = auVar17._4_4_ + auVar146._4_4_;
                      auVar171._8_4_ = auVar17._8_4_ + auVar146._8_4_;
                      auVar171._12_4_ = auVar17._12_4_ + auVar146._12_4_;
                      auVar134 = vfmsub231ps_fma(auVar186,local_1af8,auVar171);
                      auVar172._0_4_ = auVar171._0_4_ * auVar16._0_4_;
                      auVar172._4_4_ = auVar171._4_4_ * auVar16._4_4_;
                      auVar172._8_4_ = auVar171._8_4_ * auVar16._8_4_;
                      auVar172._12_4_ = auVar171._12_4_ * auVar16._12_4_;
                      auVar58 = vfmsub231ps_fma(auVar172,auVar64,auVar114);
                      fVar168 = *(float *)(ray + 0x60);
                      fVar176 = *(float *)(ray + 100);
                      fVar177 = *(float *)(ray + 0x68);
                      auVar18 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar178 = *(float *)(ray + 0x6c);
                      auVar115._0_4_ = auVar58._0_4_ * fVar168;
                      auVar115._4_4_ = auVar58._4_4_ * fVar176;
                      auVar115._8_4_ = auVar58._8_4_ * fVar177;
                      auVar115._12_4_ = auVar58._12_4_ * fVar178;
                      auVar58 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar65 = vfmadd231ps_fma(auVar115,auVar58,auVar134);
                      auVar134 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar69 = vfmadd231ps_fma(auVar65,auVar134,auVar66);
                      uVar36 = *(undefined4 *)(local_1b08 + lVar43);
                      auVar49._4_4_ = uVar36;
                      auVar49._0_4_ = uVar36;
                      auVar49._8_4_ = uVar36;
                      auVar49._12_4_ = uVar36;
                      auVar84 = vsubps_avx(auVar49,auVar84);
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar25);
                      auVar72._4_4_ = uVar36;
                      auVar72._0_4_ = uVar36;
                      auVar72._8_4_ = uVar36;
                      auVar72._12_4_ = uVar36;
                      auVar57 = vsubps_avx(auVar72,auVar57);
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar22);
                      auVar124._4_4_ = uVar36;
                      auVar124._0_4_ = uVar36;
                      auVar124._8_4_ = uVar36;
                      auVar124._12_4_ = uVar36;
                      auVar132 = vsubps_avx(auVar124,auVar132);
                      auVar65 = vsubps_avx(auVar147,auVar57);
                      auVar66 = vsubps_avx(auVar179,auVar132);
                      auVar160._0_4_ = auVar147._0_4_ + auVar57._0_4_;
                      auVar160._4_4_ = auVar147._4_4_ + auVar57._4_4_;
                      auVar160._8_4_ = auVar147._8_4_ + auVar57._8_4_;
                      auVar160._12_4_ = auVar147._12_4_ + auVar57._12_4_;
                      auVar194._0_4_ = fVar7 + auVar132._0_4_;
                      auVar194._4_4_ = fVar8 + auVar132._4_4_;
                      auVar194._8_4_ = fVar9 + auVar132._8_4_;
                      auVar194._12_4_ = fVar10 + auVar132._12_4_;
                      fVar199 = auVar66._0_4_;
                      auVar136._0_4_ = fVar199 * auVar160._0_4_;
                      fVar201 = auVar66._4_4_;
                      auVar136._4_4_ = fVar201 * auVar160._4_4_;
                      fVar202 = auVar66._8_4_;
                      auVar136._8_4_ = fVar202 * auVar160._8_4_;
                      fVar203 = auVar66._12_4_;
                      auVar136._12_4_ = fVar203 * auVar160._12_4_;
                      auVar70 = vfmsub231ps_fma(auVar136,auVar65,auVar194);
                      auVar67 = vsubps_avx(auVar146,auVar84);
                      fVar12 = auVar67._0_4_;
                      auVar195._0_4_ = auVar194._0_4_ * fVar12;
                      fVar13 = auVar67._4_4_;
                      auVar195._4_4_ = auVar194._4_4_ * fVar13;
                      fVar14 = auVar67._8_4_;
                      auVar195._8_4_ = auVar194._8_4_ * fVar14;
                      fVar15 = auVar67._12_4_;
                      auVar195._12_4_ = auVar194._12_4_ * fVar15;
                      auVar149._0_4_ = auVar146._0_4_ + auVar84._0_4_;
                      auVar149._4_4_ = auVar146._4_4_ + auVar84._4_4_;
                      auVar149._8_4_ = auVar146._8_4_ + auVar84._8_4_;
                      auVar149._12_4_ = auVar146._12_4_ + auVar84._12_4_;
                      auVar68 = vfmsub231ps_fma(auVar195,auVar66,auVar149);
                      fVar183 = auVar65._0_4_;
                      auVar150._0_4_ = fVar183 * auVar149._0_4_;
                      fVar188 = auVar65._4_4_;
                      auVar150._4_4_ = fVar188 * auVar149._4_4_;
                      fVar189 = auVar65._8_4_;
                      auVar150._8_4_ = fVar189 * auVar149._8_4_;
                      fVar190 = auVar65._12_4_;
                      auVar150._12_4_ = fVar190 * auVar149._12_4_;
                      auVar89 = vfmsub231ps_fma(auVar150,auVar67,auVar160);
                      auVar161._0_4_ = fVar168 * auVar89._0_4_;
                      auVar161._4_4_ = fVar176 * auVar89._4_4_;
                      auVar161._8_4_ = fVar177 * auVar89._8_4_;
                      auVar161._12_4_ = fVar178 * auVar89._12_4_;
                      auVar68 = vfmadd231ps_fma(auVar161,auVar58,auVar68);
                      auVar70 = vfmadd231ps_fma(auVar68,auVar134,auVar70);
                      auVar68 = vsubps_avx(auVar84,auVar17);
                      auVar50._0_4_ = auVar17._0_4_ + auVar84._0_4_;
                      auVar50._4_4_ = auVar17._4_4_ + auVar84._4_4_;
                      auVar50._8_4_ = auVar17._8_4_ + auVar84._8_4_;
                      auVar50._12_4_ = auVar17._12_4_ + auVar84._12_4_;
                      auVar17 = vsubps_avx(auVar57,auVar180);
                      auVar73._0_4_ = auVar180._0_4_ + auVar57._0_4_;
                      auVar73._4_4_ = auVar180._4_4_ + auVar57._4_4_;
                      auVar73._8_4_ = auVar180._8_4_ + auVar57._8_4_;
                      auVar73._12_4_ = auVar180._12_4_ + auVar57._12_4_;
                      auVar180 = vsubps_avx(auVar132,auVar193);
                      auVar93._0_4_ = auVar132._0_4_ + auVar193._0_4_;
                      auVar93._4_4_ = auVar132._4_4_ + auVar193._4_4_;
                      auVar93._8_4_ = auVar132._8_4_ + auVar193._8_4_;
                      auVar93._12_4_ = auVar132._12_4_ + auVar193._12_4_;
                      auVar125._0_4_ = auVar180._0_4_ * auVar73._0_4_;
                      auVar125._4_4_ = auVar180._4_4_ * auVar73._4_4_;
                      auVar125._8_4_ = auVar180._8_4_ * auVar73._8_4_;
                      auVar125._12_4_ = auVar180._12_4_ * auVar73._12_4_;
                      auVar57 = vfmsub231ps_fma(auVar125,auVar17,auVar93);
                      auVar94._0_4_ = auVar68._0_4_ * auVar93._0_4_;
                      auVar94._4_4_ = auVar68._4_4_ * auVar93._4_4_;
                      auVar94._8_4_ = auVar68._8_4_ * auVar93._8_4_;
                      auVar94._12_4_ = auVar68._12_4_ * auVar93._12_4_;
                      auVar84 = vfmsub231ps_fma(auVar94,auVar180,auVar50);
                      auVar51._0_4_ = auVar17._0_4_ * auVar50._0_4_;
                      auVar51._4_4_ = auVar17._4_4_ * auVar50._4_4_;
                      auVar51._8_4_ = auVar17._8_4_ * auVar50._8_4_;
                      auVar51._12_4_ = auVar17._12_4_ * auVar50._12_4_;
                      auVar132 = vfmsub231ps_fma(auVar51,auVar68,auVar73);
                      auVar52._0_4_ = fVar168 * auVar132._0_4_;
                      auVar52._4_4_ = fVar176 * auVar132._4_4_;
                      auVar52._8_4_ = fVar177 * auVar132._8_4_;
                      auVar52._12_4_ = fVar178 * auVar132._12_4_;
                      auVar84 = vfmadd231ps_fma(auVar52,auVar58,auVar84);
                      auVar132 = vfmadd231ps_fma(auVar84,auVar134,auVar57);
                      auVar151._0_4_ = auVar132._0_4_ + auVar69._0_4_ + auVar70._0_4_;
                      auVar151._4_4_ = auVar132._4_4_ + auVar69._4_4_ + auVar70._4_4_;
                      auVar151._8_4_ = auVar132._8_4_ + auVar69._8_4_ + auVar70._8_4_;
                      auVar151._12_4_ = auVar132._12_4_ + auVar69._12_4_ + auVar70._12_4_;
                      auVar84 = vandps_avx(auVar151,auVar191);
                      auVar74._0_8_ =
                           CONCAT44(auVar84._4_4_ * 1.1920929e-07,auVar84._0_4_ * 1.1920929e-07);
                      auVar74._8_4_ = auVar84._8_4_ * 1.1920929e-07;
                      auVar74._12_4_ = auVar84._12_4_ * 1.1920929e-07;
                      auVar84 = vminps_avx(auVar69,auVar70);
                      auVar84 = vminps_avx(auVar84,auVar132);
                      auVar126._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                      auVar126._8_4_ = -auVar74._8_4_;
                      auVar126._12_4_ = -auVar74._12_4_;
                      auVar84 = vcmpps_avx(auVar84,auVar126,5);
                      auVar57 = vmaxps_avx(auVar69,auVar70);
                      auVar57 = vmaxps_avx(auVar57,auVar132);
                      auVar57 = vcmpps_avx(auVar57,auVar74,2);
                      auVar84 = vorps_avx(auVar84,auVar57);
                      auVar57 = auVar91 & auVar84;
                      auVar84 = vandps_avx(auVar84,auVar91);
                      if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar57[0xf] < '\0') {
                        auVar53._0_4_ = fVar183 * local_1af8._0_4_;
                        auVar53._4_4_ = fVar188 * local_1af8._4_4_;
                        auVar53._8_4_ = fVar189 * local_1af8._8_4_;
                        auVar53._12_4_ = fVar190 * local_1af8._12_4_;
                        auVar75._0_4_ = fVar12 * auVar16._0_4_;
                        auVar75._4_4_ = fVar13 * auVar16._4_4_;
                        auVar75._8_4_ = fVar14 * auVar16._8_4_;
                        auVar75._12_4_ = fVar15 * auVar16._12_4_;
                        auVar193 = vfmsub213ps_fma(auVar16,auVar66,auVar53);
                        auVar95._0_4_ = auVar17._0_4_ * fVar199;
                        auVar95._4_4_ = auVar17._4_4_ * fVar201;
                        auVar95._8_4_ = auVar17._8_4_ * fVar202;
                        auVar95._12_4_ = auVar17._12_4_ * fVar203;
                        auVar127._0_4_ = fVar12 * auVar180._0_4_;
                        auVar127._4_4_ = fVar13 * auVar180._4_4_;
                        auVar127._8_4_ = fVar14 * auVar180._8_4_;
                        auVar127._12_4_ = fVar15 * auVar180._12_4_;
                        auVar180 = vfmsub213ps_fma(auVar180,auVar65,auVar95);
                        auVar57 = vandps_avx(auVar53,auVar191);
                        auVar132 = vandps_avx(auVar95,auVar191);
                        auVar57 = vcmpps_avx(auVar57,auVar132,1);
                        auVar180 = vblendvps_avx(auVar180,auVar193,auVar57);
                        auVar54._0_4_ = auVar68._0_4_ * fVar183;
                        auVar54._4_4_ = auVar68._4_4_ * fVar188;
                        auVar54._8_4_ = auVar68._8_4_ * fVar189;
                        auVar54._12_4_ = auVar68._12_4_ * fVar190;
                        auVar193 = vfmsub213ps_fma(auVar68,auVar66,auVar127);
                        auVar137._0_4_ = auVar64._0_4_ * fVar199;
                        auVar137._4_4_ = auVar64._4_4_ * fVar201;
                        auVar137._8_4_ = auVar64._8_4_ * fVar202;
                        auVar137._12_4_ = auVar64._12_4_ * fVar203;
                        auVar16 = vfmsub213ps_fma(local_1af8,auVar67,auVar137);
                        auVar57 = vandps_avx(auVar191,auVar137);
                        auVar132 = vandps_avx(auVar191,auVar127);
                        auVar57 = vcmpps_avx(auVar57,auVar132,1);
                        auVar193 = vblendvps_avx(auVar193,auVar16,auVar57);
                        auVar16 = vfmsub213ps_fma(auVar64,auVar65,auVar75);
                        auVar17 = vfmsub213ps_fma(auVar17,auVar67,auVar54);
                        auVar57 = vandps_avx(auVar191,auVar75);
                        auVar132 = vandps_avx(auVar191,auVar54);
                        auVar57 = vcmpps_avx(auVar57,auVar132,1);
                        auVar132 = vblendvps_avx(auVar17,auVar16,auVar57);
                        local_1a18 = auVar18._0_4_;
                        fStack_1a14 = auVar18._4_4_;
                        fStack_1a10 = auVar18._8_4_;
                        auVar55._0_4_ = auVar132._0_4_ * local_1a18;
                        auVar55._4_4_ = auVar132._4_4_ * fStack_1a14;
                        auVar55._8_4_ = auVar132._8_4_ * fStack_1a10;
                        auVar55._12_4_ = auVar132._12_4_ * fVar178;
                        auVar57 = vfmadd213ps_fma(auVar58,auVar193,auVar55);
                        auVar57 = vfmadd213ps_fma(auVar134,auVar180,auVar57);
                        auVar56._0_4_ = auVar57._0_4_ + auVar57._0_4_;
                        auVar56._4_4_ = auVar57._4_4_ + auVar57._4_4_;
                        auVar56._8_4_ = auVar57._8_4_ + auVar57._8_4_;
                        auVar56._12_4_ = auVar57._12_4_ + auVar57._12_4_;
                        auVar76._0_4_ = auVar132._0_4_ * fVar7;
                        auVar76._4_4_ = auVar132._4_4_ * fVar8;
                        auVar76._8_4_ = auVar132._8_4_ * fVar9;
                        auVar76._12_4_ = auVar132._12_4_ * fVar10;
                        auVar57 = vfmadd213ps_fma(auVar147,auVar193,auVar76);
                        auVar58 = vfmadd213ps_fma(auVar146,auVar180,auVar57);
                        auVar57 = vrcpps_avx(auVar56);
                        auVar181._8_4_ = 0x3f800000;
                        auVar181._0_8_ = 0x3f8000003f800000;
                        auVar181._12_4_ = 0x3f800000;
                        auVar134 = vfnmadd213ps_fma(auVar57,auVar56,auVar181);
                        auVar57 = vfmadd132ps_fma(auVar134,auVar57,auVar57);
                        auVar77._0_4_ = auVar57._0_4_ * (auVar58._0_4_ + auVar58._0_4_);
                        auVar77._4_4_ = auVar57._4_4_ * (auVar58._4_4_ + auVar58._4_4_);
                        auVar77._8_4_ = auVar57._8_4_ * (auVar58._8_4_ + auVar58._8_4_);
                        auVar77._12_4_ = auVar57._12_4_ * (auVar58._12_4_ + auVar58._12_4_);
                        auVar57 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar77,2);
                        auVar58 = vcmpps_avx(auVar77,*(undefined1 (*) [16])(ray + 0x80),2);
                        auVar57 = vandps_avx(auVar58,auVar57);
                        uVar40 = CONCAT44(auVar56._4_4_,auVar56._0_4_);
                        auVar173._0_8_ = uVar40 ^ 0x8000000080000000;
                        auVar173._8_4_ = -auVar56._8_4_;
                        auVar173._12_4_ = -auVar56._12_4_;
                        auVar58 = vcmpps_avx(auVar173,auVar56,4);
                        auVar57 = vandps_avx(auVar58,auVar57);
                        auVar57 = vpslld_avx(auVar57,0x1f);
                        auVar58 = vpsrad_avx(auVar57,0x1f);
                        auVar57 = auVar84 & auVar58;
                        auVar84 = vandps_avx(auVar58,auVar84);
                        if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar57[0xf] < '\0') {
                          local_1788 = auVar132;
                          local_1778 = auVar193;
                          local_1768 = auVar180;
                          local_1758 = auVar77;
                          local_1748 = auVar151;
                          _local_1738 = auVar70;
                          _local_1728 = auVar69;
                        }
                      }
                      auVar200 = ZEXT1664(CONCAT412(0x3f800003,
                                                    CONCAT48(0x3f800003,0x3f8000033f800003)));
                      auVar198 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                    CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                      auVar196 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar39 + 4);
                      local_1ae8._4_4_ = uVar36;
                      local_1ae8._0_4_ = uVar36;
                      local_1ae8._8_4_ = uVar36;
                      local_1ae8._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar24);
                      auVar138._4_4_ = uVar36;
                      auVar138._0_4_ = uVar36;
                      auVar138._8_4_ = uVar36;
                      auVar138._12_4_ = uVar36;
                      uVar36 = *(undefined4 *)(pGVar29 + lVar43 + lVar21);
                      auVar152._4_4_ = uVar36;
                      auVar152._0_4_ = uVar36;
                      auVar152._8_4_ = uVar36;
                      auVar152._12_4_ = uVar36;
                      uVar4 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                      pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                      uVar1 = pGVar5->mask;
                      auVar78._4_4_ = uVar1;
                      auVar78._0_4_ = uVar1;
                      auVar78._8_4_ = uVar1;
                      auVar78._12_4_ = uVar1;
                      auVar57 = vpand_avx(auVar78,*(undefined1 (*) [16])(ray + 0x90));
                      auVar57 = vpcmpeqd_avx(auVar57,_DAT_01f7aa10);
                      auVar88 = ZEXT1664(auVar57);
                      auVar132 = auVar84 & ~auVar57;
                      auVar58 = local_1ae8;
                      if ((((auVar132 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar132 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar132 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar132[0xf] < '\0') {
                        uVar36 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                        auVar84 = vandnps_avx(auVar57,auVar84);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar57 = vandps_avx(auVar191,local_1748);
                          auVar132 = vrcpps_avx(local_1748);
                          auVar164._8_4_ = 0x3f800000;
                          auVar164._0_8_ = 0x3f8000003f800000;
                          auVar164._12_4_ = 0x3f800000;
                          auVar58 = vfnmadd213ps_fma(auVar132,local_1748,auVar164);
                          auVar132 = vfmadd132ps_fma(auVar58,auVar132,auVar132);
                          auVar100._8_4_ = 0x219392ef;
                          auVar100._0_8_ = 0x219392ef219392ef;
                          auVar100._12_4_ = 0x219392ef;
                          auVar57 = vcmpps_avx(auVar57,auVar100,5);
                          auVar57 = vandps_avx(auVar57,auVar132);
                          auVar85._0_4_ = auVar57._0_4_ * (float)local_1728._0_4_;
                          auVar85._4_4_ = auVar57._4_4_ * (float)local_1728._4_4_;
                          auVar85._8_4_ = auVar57._8_4_ * fStack_1720;
                          auVar85._12_4_ = auVar57._12_4_ * fStack_171c;
                          auVar58 = vminps_avx(auVar85,auVar164);
                          auVar101._0_4_ = auVar57._0_4_ * (float)local_1738._0_4_;
                          auVar101._4_4_ = auVar57._4_4_ * (float)local_1738._4_4_;
                          auVar101._8_4_ = auVar57._8_4_ * fStack_1730;
                          auVar101._12_4_ = auVar57._12_4_ * fStack_172c;
                          auVar134 = vminps_avx(auVar101,auVar164);
                          uVar2 = *(undefined4 *)(pGVar29 + lVar43 + lVar26 + -4);
                          auVar119._4_4_ = uVar2;
                          auVar119._0_4_ = uVar2;
                          auVar119._8_4_ = uVar2;
                          auVar119._12_4_ = uVar2;
                          auVar132 = vpsrld_avx(auVar119,0x10);
                          auVar147 = ZEXT816(0) << 0x20;
                          auVar57 = vpblendw_avx(auVar119,auVar147,0xaa);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar132 = vcvtdq2ps_avx(auVar132);
                          uVar2 = *(undefined4 *)(pGVar29 + lVar43 + lVar26);
                          auVar120._4_4_ = uVar2;
                          auVar120._0_4_ = uVar2;
                          auVar120._8_4_ = uVar2;
                          auVar120._12_4_ = uVar2;
                          uVar2 = *(undefined4 *)(pGVar29 + lVar43 + lVar19);
                          auVar156._4_4_ = uVar2;
                          auVar156._0_4_ = uVar2;
                          auVar156._8_4_ = uVar2;
                          auVar156._12_4_ = uVar2;
                          auVar146 = vsubps_avx(auVar164,auVar58);
                          auVar146 = vsubps_avx(auVar146,auVar134);
                          auVar144._0_4_ = auVar146._0_4_ * auVar57._0_4_ * 0.00012207031;
                          auVar144._4_4_ = auVar146._4_4_ * auVar57._4_4_ * 0.00012207031;
                          auVar144._8_4_ = auVar146._8_4_ * auVar57._8_4_ * 0.00012207031;
                          auVar144._12_4_ = auVar146._12_4_ * auVar57._12_4_ * 0.00012207031;
                          auVar131._0_4_ = auVar146._0_4_ * auVar132._0_4_ * 0.00012207031;
                          auVar131._4_4_ = auVar146._4_4_ * auVar132._4_4_ * 0.00012207031;
                          auVar131._8_4_ = auVar146._8_4_ * auVar132._8_4_ * 0.00012207031;
                          auVar131._12_4_ = auVar146._12_4_ * auVar132._12_4_ * 0.00012207031;
                          auVar57 = vpblendw_avx(auVar156,auVar147,0xaa);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar165._0_4_ = auVar57._0_4_ * 0.00012207031;
                          auVar165._4_4_ = auVar57._4_4_ * 0.00012207031;
                          auVar165._8_4_ = auVar57._8_4_ * 0.00012207031;
                          auVar165._12_4_ = auVar57._12_4_ * 0.00012207031;
                          auVar132 = vfmadd231ps_fma(auVar144,auVar134,auVar165);
                          auVar57 = vpsrld_avx(auVar156,0x10);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar157._0_4_ = auVar57._0_4_ * 0.00012207031;
                          auVar157._4_4_ = auVar57._4_4_ * 0.00012207031;
                          auVar157._8_4_ = auVar57._8_4_ * 0.00012207031;
                          auVar157._12_4_ = auVar57._12_4_ * 0.00012207031;
                          auVar134 = vfmadd231ps_fma(auVar131,auVar134,auVar157);
                          auVar57 = vpblendw_avx(auVar120,auVar147,0xaa);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar102._0_4_ = auVar57._0_4_ * 0.00012207031;
                          auVar102._4_4_ = auVar57._4_4_ * 0.00012207031;
                          auVar102._8_4_ = auVar57._8_4_ * 0.00012207031;
                          auVar102._12_4_ = auVar57._12_4_ * 0.00012207031;
                          local_1958 = vfmadd231ps_fma(auVar132,auVar58,auVar102);
                          auVar57 = vpsrld_avx(auVar120,0x10);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar103._0_4_ = auVar57._0_4_ * 0.00012207031;
                          auVar103._4_4_ = auVar57._4_4_ * 0.00012207031;
                          auVar103._8_4_ = auVar57._8_4_ * 0.00012207031;
                          auVar103._12_4_ = auVar57._12_4_ * 0.00012207031;
                          local_1948 = vfmadd231ps_fma(auVar134,auVar58,auVar103);
                          local_1988 = local_1768._0_8_;
                          uStack_1980 = local_1768._8_8_;
                          local_1978 = local_1778._0_8_;
                          uStack_1970 = local_1778._8_8_;
                          local_1968 = local_1788._0_8_;
                          uStack_1960 = local_1788._8_8_;
                          local_1928._4_4_ = uVar4;
                          local_1928._0_4_ = uVar4;
                          local_1928._8_4_ = uVar4;
                          local_1928._12_4_ = uVar4;
                          vpcmpeqd_avx2(ZEXT1632(local_1928),ZEXT1632(local_1928));
                          uStack_1914 = context->user->instID[0];
                          local_1918 = uStack_1914;
                          uStack_1910 = uStack_1914;
                          uStack_190c = uStack_1914;
                          uStack_1908 = context->user->instPrimID[0];
                          uStack_1904 = uStack_1908;
                          uStack_1900 = uStack_1908;
                          uStack_18fc = uStack_1908;
                          local_1af8 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar57 = vblendvps_avx(local_1af8,local_1758,auVar84);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar57;
                          args.valid = (int *)local_1b28;
                          args.geometryUserPtr = pGVar5->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_1988;
                          args.N = 4;
                          local_1b28 = auVar84;
                          args.ray = (RTCRayN *)ray;
                          local_1938 = uVar36;
                          uStack_1934 = uVar36;
                          uStack_1930 = uVar36;
                          uStack_192c = uVar36;
                          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar5->occlusionFilterN)(&args);
                            auVar200 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                            auVar198 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                            auVar196 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                          }
                          if (local_1b28 == (undefined1  [16])0x0) {
                            auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar84 = auVar84 ^ _DAT_01f7ae20;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var6)(&args);
                              auVar200 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                              auVar198 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar196 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                            }
                            auVar57 = vpcmpeqd_avx(local_1b28,_DAT_01f7aa10);
                            auVar84 = auVar57 ^ _DAT_01f7ae20;
                            auVar109._8_4_ = 0xff800000;
                            auVar109._0_8_ = 0xff800000ff800000;
                            auVar109._12_4_ = 0xff800000;
                            auVar57 = vblendvps_avx(auVar109,*(undefined1 (*) [16])(args.ray + 0x80)
                                                    ,auVar57);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar57;
                          }
                          auVar57 = vpslld_avx(auVar84,0x1f);
                          auVar84 = vpsrad_avx(auVar57,0x1f);
                          auVar57 = vblendvps_avx(local_1af8,*(undefined1 (*) [16])local_1b10,
                                                  auVar57);
                          auVar88 = ZEXT1664(auVar57);
                          *(undefined1 (*) [16])local_1b10 = auVar57;
                          auVar179 = local_1ae8;
                          auVar58 = local_1ae8;
                        }
                        local_1ae8 = auVar179;
                        auVar91 = vpandn_avx(auVar84,auVar91);
                        auVar179 = local_1ae8;
                      }
                      local_1ae8 = auVar179;
                      auVar111 = ZEXT1664(auVar91);
                      if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar91 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar91[0xf]) break;
                      auVar84 = *(undefined1 (*) [16])ray;
                      auVar57 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar132 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar134 = vsubps_avx(auVar185,auVar84);
                      local_1ae8 = vsubps_avx(auVar113,auVar57);
                      local_1af8 = vsubps_avx(auVar135,auVar132);
                      auVar146 = vsubps_avx(auVar49,auVar84);
                      auVar147 = vsubps_avx(auVar72,auVar57);
                      auVar179 = vsubps_avx(auVar124,auVar132);
                      auVar58 = vsubps_avx(auVar58,auVar84);
                      auVar180 = vsubps_avx(auVar138,auVar57);
                      auVar132 = vsubps_avx(auVar152,auVar132);
                      auVar193 = vsubps_avx(auVar58,auVar134);
                      auVar16 = vsubps_avx(auVar180,local_1ae8);
                      auVar17 = vsubps_avx(auVar132,local_1af8);
                      auVar116._0_4_ = auVar58._0_4_ + auVar134._0_4_;
                      auVar116._4_4_ = auVar58._4_4_ + auVar134._4_4_;
                      auVar116._8_4_ = auVar58._8_4_ + auVar134._8_4_;
                      auVar116._12_4_ = auVar58._12_4_ + auVar134._12_4_;
                      auVar153._0_4_ = local_1ae8._0_4_ + auVar180._0_4_;
                      auVar153._4_4_ = local_1ae8._4_4_ + auVar180._4_4_;
                      auVar153._8_4_ = local_1ae8._8_4_ + auVar180._8_4_;
                      auVar153._12_4_ = local_1ae8._12_4_ + auVar180._12_4_;
                      fVar199 = local_1af8._0_4_;
                      auVar174._0_4_ = fVar199 + auVar132._0_4_;
                      fVar201 = local_1af8._4_4_;
                      auVar174._4_4_ = fVar201 + auVar132._4_4_;
                      fVar202 = local_1af8._8_4_;
                      auVar174._8_4_ = fVar202 + auVar132._8_4_;
                      fVar203 = local_1af8._12_4_;
                      auVar174._12_4_ = fVar203 + auVar132._12_4_;
                      auVar192._0_4_ = auVar17._0_4_ * auVar153._0_4_;
                      auVar192._4_4_ = auVar17._4_4_ * auVar153._4_4_;
                      auVar192._8_4_ = auVar17._8_4_ * auVar153._8_4_;
                      auVar192._12_4_ = auVar17._12_4_ * auVar153._12_4_;
                      auVar65 = vfmsub231ps_fma(auVar192,auVar16,auVar174);
                      auVar187._0_4_ = auVar174._0_4_ * auVar193._0_4_;
                      auVar187._4_4_ = auVar174._4_4_ * auVar193._4_4_;
                      auVar187._8_4_ = auVar174._8_4_ * auVar193._8_4_;
                      auVar187._12_4_ = auVar174._12_4_ * auVar193._12_4_;
                      auVar57 = vfmsub231ps_fma(auVar187,auVar17,auVar116);
                      auVar117._0_4_ = auVar116._0_4_ * auVar16._0_4_;
                      auVar117._4_4_ = auVar116._4_4_ * auVar16._4_4_;
                      auVar117._8_4_ = auVar116._8_4_ * auVar16._8_4_;
                      auVar117._12_4_ = auVar116._12_4_ * auVar16._12_4_;
                      auVar64 = vfmsub231ps_fma(auVar117,auVar193,auVar153);
                      auVar84 = *(undefined1 (*) [16])(ray + 0x60);
                      fVar168 = auVar84._0_4_;
                      auVar118._0_4_ = fVar168 * auVar64._0_4_;
                      fVar176 = auVar84._4_4_;
                      auVar118._4_4_ = fVar176 * auVar64._4_4_;
                      fVar177 = auVar84._8_4_;
                      auVar118._8_4_ = fVar177 * auVar64._8_4_;
                      fVar178 = auVar84._12_4_;
                      auVar118._12_4_ = fVar178 * auVar64._12_4_;
                      auVar84 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar64 = vfmadd231ps_fma(auVar118,auVar84,auVar57);
                      auVar57 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar68 = vfmadd231ps_fma(auVar64,auVar57,auVar65);
                      auVar64 = vsubps_avx(local_1ae8,auVar147);
                      auVar65 = vsubps_avx(local_1af8,auVar179);
                      auVar154._0_4_ = local_1ae8._0_4_ + auVar147._0_4_;
                      auVar154._4_4_ = local_1ae8._4_4_ + auVar147._4_4_;
                      auVar154._8_4_ = local_1ae8._8_4_ + auVar147._8_4_;
                      auVar154._12_4_ = local_1ae8._12_4_ + auVar147._12_4_;
                      auVar204._0_4_ = fVar199 + auVar179._0_4_;
                      auVar204._4_4_ = fVar201 + auVar179._4_4_;
                      auVar204._8_4_ = fVar202 + auVar179._8_4_;
                      auVar204._12_4_ = fVar203 + auVar179._12_4_;
                      fVar183 = auVar65._0_4_;
                      auVar139._0_4_ = fVar183 * auVar154._0_4_;
                      fVar188 = auVar65._4_4_;
                      auVar139._4_4_ = fVar188 * auVar154._4_4_;
                      fVar189 = auVar65._8_4_;
                      auVar139._8_4_ = fVar189 * auVar154._8_4_;
                      fVar190 = auVar65._12_4_;
                      auVar139._12_4_ = fVar190 * auVar154._12_4_;
                      auVar69 = vfmsub231ps_fma(auVar139,auVar64,auVar204);
                      auVar66 = vsubps_avx(auVar134,auVar146);
                      fVar7 = auVar66._0_4_;
                      auVar205._0_4_ = auVar204._0_4_ * fVar7;
                      fVar9 = auVar66._4_4_;
                      auVar205._4_4_ = auVar204._4_4_ * fVar9;
                      fVar12 = auVar66._8_4_;
                      auVar205._8_4_ = auVar204._8_4_ * fVar12;
                      fVar14 = auVar66._12_4_;
                      auVar205._12_4_ = auVar204._12_4_ * fVar14;
                      auVar162._0_4_ = auVar146._0_4_ + auVar134._0_4_;
                      auVar162._4_4_ = auVar146._4_4_ + auVar134._4_4_;
                      auVar162._8_4_ = auVar146._8_4_ + auVar134._8_4_;
                      auVar162._12_4_ = auVar146._12_4_ + auVar134._12_4_;
                      auVar67 = vfmsub231ps_fma(auVar205,auVar65,auVar162);
                      fVar8 = auVar64._0_4_;
                      auVar163._0_4_ = auVar162._0_4_ * fVar8;
                      fVar10 = auVar64._4_4_;
                      auVar163._4_4_ = auVar162._4_4_ * fVar10;
                      fVar13 = auVar64._8_4_;
                      auVar163._8_4_ = auVar162._8_4_ * fVar13;
                      fVar15 = auVar64._12_4_;
                      auVar163._12_4_ = auVar162._12_4_ * fVar15;
                      auVar70 = vfmsub231ps_fma(auVar163,auVar66,auVar154);
                      auVar155._0_4_ = fVar168 * auVar70._0_4_;
                      auVar155._4_4_ = fVar176 * auVar70._4_4_;
                      auVar155._8_4_ = fVar177 * auVar70._8_4_;
                      auVar155._12_4_ = fVar178 * auVar70._12_4_;
                      auVar67 = vfmadd231ps_fma(auVar155,auVar84,auVar67);
                      auVar69 = vfmadd231ps_fma(auVar67,auVar57,auVar69);
                      auVar67 = vsubps_avx(auVar146,auVar58);
                      auVar79._0_4_ = auVar146._0_4_ + auVar58._0_4_;
                      auVar79._4_4_ = auVar146._4_4_ + auVar58._4_4_;
                      auVar79._8_4_ = auVar146._8_4_ + auVar58._8_4_;
                      auVar79._12_4_ = auVar146._12_4_ + auVar58._12_4_;
                      auVar146 = vsubps_avx(auVar147,auVar180);
                      auVar59._0_4_ = auVar147._0_4_ + auVar180._0_4_;
                      auVar59._4_4_ = auVar147._4_4_ + auVar180._4_4_;
                      auVar59._8_4_ = auVar147._8_4_ + auVar180._8_4_;
                      auVar59._12_4_ = auVar147._12_4_ + auVar180._12_4_;
                      auVar147 = vsubps_avx(auVar179,auVar132);
                      auVar96._0_4_ = auVar179._0_4_ + auVar132._0_4_;
                      auVar96._4_4_ = auVar179._4_4_ + auVar132._4_4_;
                      auVar96._8_4_ = auVar179._8_4_ + auVar132._8_4_;
                      auVar96._12_4_ = auVar179._12_4_ + auVar132._12_4_;
                      auVar128._0_4_ = auVar147._0_4_ * auVar59._0_4_;
                      auVar128._4_4_ = auVar147._4_4_ * auVar59._4_4_;
                      auVar128._8_4_ = auVar147._8_4_ * auVar59._8_4_;
                      auVar128._12_4_ = auVar147._12_4_ * auVar59._12_4_;
                      auVar58 = vfmsub231ps_fma(auVar128,auVar146,auVar96);
                      auVar97._0_4_ = auVar67._0_4_ * auVar96._0_4_;
                      auVar97._4_4_ = auVar67._4_4_ * auVar96._4_4_;
                      auVar97._8_4_ = auVar67._8_4_ * auVar96._8_4_;
                      auVar97._12_4_ = auVar67._12_4_ * auVar96._12_4_;
                      auVar132 = vfmsub231ps_fma(auVar97,auVar147,auVar79);
                      auVar80._0_4_ = auVar146._0_4_ * auVar79._0_4_;
                      auVar80._4_4_ = auVar146._4_4_ * auVar79._4_4_;
                      auVar80._8_4_ = auVar146._8_4_ * auVar79._8_4_;
                      auVar80._12_4_ = auVar146._12_4_ * auVar79._12_4_;
                      auVar179 = vfmsub231ps_fma(auVar80,auVar67,auVar59);
                      auVar60._0_4_ = fVar168 * auVar179._0_4_;
                      auVar60._4_4_ = fVar176 * auVar179._4_4_;
                      auVar60._8_4_ = fVar177 * auVar179._8_4_;
                      auVar60._12_4_ = fVar178 * auVar179._12_4_;
                      auVar132 = vfmadd231ps_fma(auVar60,auVar84,auVar132);
                      auVar179 = vfmadd231ps_fma(auVar132,auVar57,auVar58);
                      auVar140._0_4_ = auVar179._0_4_ + auVar68._0_4_ + auVar69._0_4_;
                      auVar140._4_4_ = auVar179._4_4_ + auVar68._4_4_ + auVar69._4_4_;
                      auVar140._8_4_ = auVar179._8_4_ + auVar68._8_4_ + auVar69._8_4_;
                      auVar140._12_4_ = auVar179._12_4_ + auVar68._12_4_ + auVar69._12_4_;
                      auVar132 = vandps_avx(auVar140,auVar191);
                      auVar81._0_4_ = auVar132._0_4_ * 1.1920929e-07;
                      auVar81._4_4_ = auVar132._4_4_ * 1.1920929e-07;
                      auVar81._8_4_ = auVar132._8_4_ * 1.1920929e-07;
                      auVar81._12_4_ = auVar132._12_4_ * 1.1920929e-07;
                      auVar132 = vminps_avx(auVar68,auVar69);
                      auVar132 = vminps_avx(auVar132,auVar179);
                      uVar40 = CONCAT44(auVar81._4_4_,auVar81._0_4_);
                      auVar129._0_8_ = uVar40 ^ 0x8000000080000000;
                      auVar129._8_4_ = -auVar81._8_4_;
                      auVar129._12_4_ = -auVar81._12_4_;
                      auVar132 = vcmpps_avx(auVar132,auVar129,5);
                      auVar58 = vmaxps_avx(auVar68,auVar69);
                      auVar58 = vmaxps_avx(auVar58,auVar179);
                      auVar58 = vcmpps_avx(auVar58,auVar81,2);
                      auVar132 = vorps_avx(auVar132,auVar58);
                      auVar58 = auVar91 & auVar132;
                      auVar132 = vandps_avx(auVar132,auVar91);
                      if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar58[0xf] < '\0') {
                        auVar61._0_4_ = fVar8 * auVar17._0_4_;
                        auVar61._4_4_ = fVar10 * auVar17._4_4_;
                        auVar61._8_4_ = fVar13 * auVar17._8_4_;
                        auVar61._12_4_ = fVar15 * auVar17._12_4_;
                        local_1a58._4_4_ = fVar9 * auVar16._4_4_;
                        local_1a58._0_4_ = fVar7 * auVar16._0_4_;
                        fStack_1a50 = fVar12 * auVar16._8_4_;
                        fStack_1a4c = fVar14 * auVar16._12_4_;
                        auVar179 = vfmsub213ps_fma(auVar16,auVar65,auVar61);
                        auVar98._0_4_ = auVar146._0_4_ * fVar183;
                        auVar98._4_4_ = auVar146._4_4_ * fVar188;
                        auVar98._8_4_ = auVar146._8_4_ * fVar189;
                        auVar98._12_4_ = auVar146._12_4_ * fVar190;
                        auVar130._0_4_ = fVar7 * auVar147._0_4_;
                        auVar130._4_4_ = fVar9 * auVar147._4_4_;
                        auVar130._8_4_ = fVar12 * auVar147._8_4_;
                        auVar130._12_4_ = fVar14 * auVar147._12_4_;
                        auVar180 = vfmsub213ps_fma(auVar147,auVar64,auVar98);
                        auVar58 = vandps_avx(auVar191,auVar61);
                        auVar147 = vandps_avx(auVar191,auVar98);
                        auVar58 = vcmpps_avx(auVar58,auVar147,1);
                        auVar179 = vblendvps_avx(auVar180,auVar179,auVar58);
                        auVar141._0_4_ = auVar67._0_4_ * fVar8;
                        auVar141._4_4_ = auVar67._4_4_ * fVar10;
                        auVar141._8_4_ = auVar67._8_4_ * fVar13;
                        auVar141._12_4_ = auVar67._12_4_ * fVar15;
                        auVar180 = vfmsub213ps_fma(auVar67,auVar65,auVar130);
                        auVar99._0_4_ = fVar183 * auVar193._0_4_;
                        auVar99._4_4_ = fVar188 * auVar193._4_4_;
                        auVar99._8_4_ = fVar189 * auVar193._8_4_;
                        auVar99._12_4_ = fVar190 * auVar193._12_4_;
                        auVar16 = vfmsub213ps_fma(auVar17,auVar66,auVar99);
                        auVar58 = vandps_avx(auVar191,auVar99);
                        auVar147 = vandps_avx(auVar191,auVar130);
                        auVar58 = vcmpps_avx(auVar58,auVar147,1);
                        auVar147 = vblendvps_avx(auVar180,auVar16,auVar58);
                        auVar180 = vfmsub213ps_fma(auVar193,auVar64,_local_1a58);
                        auVar193 = vfmsub213ps_fma(auVar146,auVar66,auVar141);
                        auVar58 = vandps_avx(auVar191,_local_1a58);
                        auVar146 = vandps_avx(auVar191,auVar141);
                        auVar58 = vcmpps_avx(auVar58,auVar146,1);
                        auVar58 = vblendvps_avx(auVar193,auVar180,auVar58);
                        auVar82._0_4_ = auVar58._0_4_ * fVar168;
                        auVar82._4_4_ = auVar58._4_4_ * fVar176;
                        auVar82._8_4_ = auVar58._8_4_ * fVar177;
                        auVar82._12_4_ = auVar58._12_4_ * fVar178;
                        auVar84 = vfmadd213ps_fma(auVar84,auVar147,auVar82);
                        auVar84 = vfmadd213ps_fma(auVar57,auVar179,auVar84);
                        auVar83._0_4_ = auVar84._0_4_ + auVar84._0_4_;
                        auVar83._4_4_ = auVar84._4_4_ + auVar84._4_4_;
                        auVar83._8_4_ = auVar84._8_4_ + auVar84._8_4_;
                        auVar83._12_4_ = auVar84._12_4_ + auVar84._12_4_;
                        auVar142._0_4_ = auVar58._0_4_ * fVar199;
                        auVar142._4_4_ = auVar58._4_4_ * fVar201;
                        auVar142._8_4_ = auVar58._8_4_ * fVar202;
                        auVar142._12_4_ = auVar58._12_4_ * fVar203;
                        auVar84 = vfmadd213ps_fma(local_1ae8,auVar147,auVar142);
                        auVar57 = vfmadd213ps_fma(auVar134,auVar179,auVar84);
                        auVar84 = vrcpps_avx(auVar83);
                        auVar182._8_4_ = 0x3f800000;
                        auVar182._0_8_ = 0x3f8000003f800000;
                        auVar182._12_4_ = 0x3f800000;
                        auVar134 = vfnmadd213ps_fma(auVar84,auVar83,auVar182);
                        auVar84 = vfmadd132ps_fma(auVar134,auVar84,auVar84);
                        auVar143._0_4_ = auVar84._0_4_ * (auVar57._0_4_ + auVar57._0_4_);
                        auVar143._4_4_ = auVar84._4_4_ * (auVar57._4_4_ + auVar57._4_4_);
                        auVar143._8_4_ = auVar84._8_4_ * (auVar57._8_4_ + auVar57._8_4_);
                        auVar143._12_4_ = auVar84._12_4_ * (auVar57._12_4_ + auVar57._12_4_);
                        auVar84 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar143,2);
                        auVar57 = vcmpps_avx(auVar143,*(undefined1 (*) [16])(ray + 0x80),2);
                        auVar84 = vandps_avx(auVar57,auVar84);
                        uVar40 = CONCAT44(auVar83._4_4_,auVar83._0_4_);
                        auVar175._0_8_ = uVar40 ^ 0x8000000080000000;
                        auVar175._8_4_ = -auVar83._8_4_;
                        auVar175._12_4_ = -auVar83._12_4_;
                        auVar57 = vcmpps_avx(auVar175,auVar83,4);
                        auVar84 = vandps_avx(auVar57,auVar84);
                        auVar84 = vpslld_avx(auVar84,0x1f);
                        auVar57 = vpsrad_avx(auVar84,0x1f);
                        auVar84 = auVar132 & auVar57;
                        auVar132 = vandps_avx(auVar57,auVar132);
                        if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar84[0xf] < '\0') {
                          local_17f8 = auVar58;
                          local_17e8 = auVar147;
                          local_17d8 = auVar179;
                          local_17c8 = auVar143;
                          local_17b8 = auVar140;
                          _local_17a8 = auVar69;
                          _local_1798 = auVar68;
                        }
                      }
                      auVar200 = ZEXT1664(CONCAT412(0x3f800003,
                                                    CONCAT48(0x3f800003,0x3f8000033f800003)));
                      auVar198 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                    CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                      auVar196 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar88 = ZEXT1664(auVar132);
                      uVar4 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                      pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                      uVar1 = pGVar5->mask;
                      auVar62._4_4_ = uVar1;
                      auVar62._0_4_ = uVar1;
                      auVar62._8_4_ = uVar1;
                      auVar62._12_4_ = uVar1;
                      auVar84 = vpand_avx(auVar62,*(undefined1 (*) [16])(ray + 0x90));
                      auVar84 = vpcmpeqd_avx(auVar84,_DAT_01f7aa10);
                      auVar57 = auVar132 & ~auVar84;
                      if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar57[0xf] < '\0') {
                        uVar36 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                        auVar84 = vandnps_avx(auVar84,auVar132);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar57 = vandps_avx(auVar191,local_17b8);
                          auVar132 = vrcpps_avx(local_17b8);
                          auVar166._8_4_ = 0x3f800000;
                          auVar166._0_8_ = 0x3f8000003f800000;
                          auVar166._12_4_ = 0x3f800000;
                          auVar58 = vfnmadd213ps_fma(auVar132,local_17b8,auVar166);
                          auVar132 = vfmadd132ps_fma(auVar58,auVar132,auVar132);
                          auVar104._8_4_ = 0x219392ef;
                          auVar104._0_8_ = 0x219392ef219392ef;
                          auVar104._12_4_ = 0x219392ef;
                          auVar57 = vcmpps_avx(auVar57,auVar104,5);
                          auVar57 = vandps_avx(auVar57,auVar132);
                          auVar86._0_4_ = auVar57._0_4_ * (float)local_1798._0_4_;
                          auVar86._4_4_ = auVar57._4_4_ * (float)local_1798._4_4_;
                          auVar86._8_4_ = auVar57._8_4_ * fStack_1790;
                          auVar86._12_4_ = auVar57._12_4_ * fStack_178c;
                          auVar58 = vminps_avx(auVar86,auVar166);
                          auVar105._0_4_ = auVar57._0_4_ * (float)local_17a8._0_4_;
                          auVar105._4_4_ = auVar57._4_4_ * (float)local_17a8._4_4_;
                          auVar105._8_4_ = auVar57._8_4_ * fStack_17a0;
                          auVar105._12_4_ = auVar57._12_4_ * fStack_179c;
                          auVar134 = vminps_avx(auVar105,auVar166);
                          uVar2 = *(undefined4 *)(pGVar29 + lVar43 + lVar19);
                          auVar121._4_4_ = uVar2;
                          auVar121._0_4_ = uVar2;
                          auVar121._8_4_ = uVar2;
                          auVar121._12_4_ = uVar2;
                          auVar132 = vpsrld_avx(auVar121,0x10);
                          auVar147 = ZEXT816(0) << 0x20;
                          auVar57 = vpblendw_avx(auVar121,auVar147,0xaa);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar132 = vcvtdq2ps_avx(auVar132);
                          uVar2 = *(undefined4 *)(pGVar29 + lVar43 + lVar26);
                          auVar122._4_4_ = uVar2;
                          auVar122._0_4_ = uVar2;
                          auVar122._8_4_ = uVar2;
                          auVar122._12_4_ = uVar2;
                          uVar2 = *(undefined4 *)(pGVar29 + lVar43 + lVar19 + 4);
                          auVar158._4_4_ = uVar2;
                          auVar158._0_4_ = uVar2;
                          auVar158._8_4_ = uVar2;
                          auVar158._12_4_ = uVar2;
                          auVar146 = vsubps_avx(auVar166,auVar58);
                          auVar146 = vsubps_avx(auVar146,auVar134);
                          auVar145._0_4_ = auVar146._0_4_ * auVar57._0_4_ * 0.00012207031;
                          auVar145._4_4_ = auVar146._4_4_ * auVar57._4_4_ * 0.00012207031;
                          auVar145._8_4_ = auVar146._8_4_ * auVar57._8_4_ * 0.00012207031;
                          auVar145._12_4_ = auVar146._12_4_ * auVar57._12_4_ * 0.00012207031;
                          auVar133._0_4_ = auVar146._0_4_ * auVar132._0_4_ * 0.00012207031;
                          auVar133._4_4_ = auVar146._4_4_ * auVar132._4_4_ * 0.00012207031;
                          auVar133._8_4_ = auVar146._8_4_ * auVar132._8_4_ * 0.00012207031;
                          auVar133._12_4_ = auVar146._12_4_ * auVar132._12_4_ * 0.00012207031;
                          auVar57 = vpblendw_avx(auVar158,auVar147,0xaa);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar167._0_4_ = auVar57._0_4_ * 0.00012207031;
                          auVar167._4_4_ = auVar57._4_4_ * 0.00012207031;
                          auVar167._8_4_ = auVar57._8_4_ * 0.00012207031;
                          auVar167._12_4_ = auVar57._12_4_ * 0.00012207031;
                          auVar132 = vfmadd231ps_fma(auVar145,auVar134,auVar167);
                          auVar57 = vpsrld_avx(auVar158,0x10);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar159._0_4_ = auVar57._0_4_ * 0.00012207031;
                          auVar159._4_4_ = auVar57._4_4_ * 0.00012207031;
                          auVar159._8_4_ = auVar57._8_4_ * 0.00012207031;
                          auVar159._12_4_ = auVar57._12_4_ * 0.00012207031;
                          auVar134 = vfmadd231ps_fma(auVar133,auVar134,auVar159);
                          auVar57 = vpblendw_avx(auVar122,auVar147,0xaa);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar106._0_4_ = auVar57._0_4_ * 0.00012207031;
                          auVar106._4_4_ = auVar57._4_4_ * 0.00012207031;
                          auVar106._8_4_ = auVar57._8_4_ * 0.00012207031;
                          auVar106._12_4_ = auVar57._12_4_ * 0.00012207031;
                          local_1958 = vfmadd231ps_fma(auVar132,auVar58,auVar106);
                          auVar57 = vpsrld_avx(auVar122,0x10);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar107._0_4_ = auVar57._0_4_ * 0.00012207031;
                          auVar107._4_4_ = auVar57._4_4_ * 0.00012207031;
                          auVar107._8_4_ = auVar57._8_4_ * 0.00012207031;
                          auVar107._12_4_ = auVar57._12_4_ * 0.00012207031;
                          local_1948 = vfmadd231ps_fma(auVar134,auVar58,auVar107);
                          local_1988 = local_17d8._0_8_;
                          uStack_1980 = local_17d8._8_8_;
                          local_1978 = local_17e8._0_8_;
                          uStack_1970 = local_17e8._8_8_;
                          local_1968 = local_17f8._0_8_;
                          uStack_1960 = local_17f8._8_8_;
                          local_1928._4_4_ = uVar4;
                          local_1928._0_4_ = uVar4;
                          local_1928._8_4_ = uVar4;
                          local_1928._12_4_ = uVar4;
                          vpcmpeqd_avx2(ZEXT1632(local_1928),ZEXT1632(local_1928));
                          uStack_1914 = context->user->instID[0];
                          local_1918 = uStack_1914;
                          uStack_1910 = uStack_1914;
                          uStack_190c = uStack_1914;
                          uStack_1908 = context->user->instPrimID[0];
                          uStack_1904 = uStack_1908;
                          uStack_1900 = uStack_1908;
                          uStack_18fc = uStack_1908;
                          auVar57 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar132 = vblendvps_avx(auVar57,local_17c8,auVar84);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar132;
                          args.valid = (int *)local_1b28;
                          args.geometryUserPtr = pGVar5->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_1988;
                          args.N = 4;
                          local_1b28 = auVar84;
                          args.ray = (RTCRayN *)ray;
                          local_1938 = uVar36;
                          uStack_1934 = uVar36;
                          uStack_1930 = uVar36;
                          uStack_192c = uVar36;
                          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar5->occlusionFilterN)(&args);
                            auVar200 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                            auVar198 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                            auVar196 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                          }
                          if (local_1b28 == (undefined1  [16])0x0) {
                            auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar84 = auVar84 ^ _DAT_01f7ae20;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var6)(&args);
                              auVar200 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                              auVar198 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar196 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                            }
                            auVar132 = vpcmpeqd_avx(local_1b28,_DAT_01f7aa10);
                            auVar84 = auVar132 ^ _DAT_01f7ae20;
                            auVar108._8_4_ = 0xff800000;
                            auVar108._0_8_ = 0xff800000ff800000;
                            auVar108._12_4_ = 0xff800000;
                            auVar132 = vblendvps_avx(auVar108,*(undefined1 (*) [16])
                                                               (args.ray + 0x80),auVar132);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar132;
                          }
                          auVar132 = vpslld_avx(auVar84,0x1f);
                          auVar84 = vpsrad_avx(auVar132,0x1f);
                          auVar57 = vblendvps_avx(auVar57,*(undefined1 (*) [16])local_1b10,auVar132)
                          ;
                          auVar88 = ZEXT1664(auVar57);
                          *(undefined1 (*) [16])local_1b10 = auVar57;
                        }
                        auVar91 = vandnps_avx(auVar84,auVar91);
                      }
                      auVar111 = ZEXT1664(auVar91);
                      lVar43 = lVar43 + 4;
                    } while ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                              (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             auVar91[0xf] < '\0');
                    lVar43 = 1;
                    uVar34 = 0;
                  } while (((byte)local_1afc & iVar32 != 2) != 0);
                  auVar84 = vpcmpeqd_avx(auVar88._0_16_,auVar88._0_16_);
                  auVar63._0_4_ = auVar111._0_4_ ^ auVar84._0_4_;
                  auVar63._4_4_ = auVar111._4_4_ ^ auVar84._4_4_;
                  auVar63._8_4_ = auVar111._8_4_ ^ auVar84._8_4_;
                  auVar63._12_4_ = auVar111._12_4_ ^ auVar84._12_4_;
                  sVar35 = 0;
                }
                else {
                  pre.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                  sVar35 = *(size_t *)
                            (pre.super_Precalculations.grid +
                            (ulong)*(uint *)(pre.super_Precalculations.grid + 0x2c) + 0x30);
                  auVar63._8_8_ = uVar28;
                  auVar63._0_8_ = uVar27;
                  auVar84 = vpcmpeqd_avx(auVar57,auVar57);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx(auVar63,(undefined1  [16])terminated.field_0);
                auVar84 = auVar84 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar84 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar84 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar84[0xf]) goto LAB_019c747f;
                auVar110._8_4_ = 0xff800000;
                auVar110._0_8_ = 0xff800000ff800000;
                auVar110._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar110,
                                   (undefined1  [16])terminated.field_0);
                if (sVar35 != 0) {
                  pNVar47->ptr = sVar35;
                  pNVar47 = pNVar47 + 1;
                  paVar46->i[0] = -0x800000;
                  paVar46->i[1] = -0x800000;
                  paVar46->i[2] = -0x800000;
                  paVar46->i[3] = -0x800000;
                  paVar46 = paVar46 + 1;
                }
              }
              goto LAB_019c5ead;
            }
            lVar37 = 0;
            sVar35 = 8;
            auVar84 = auVar196._0_16_;
            do {
              sVar41 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar37 * 8);
              if (sVar41 == 8) {
                auVar88 = ZEXT1664(auVar84);
                sVar41 = sVar35;
                break;
              }
              uVar36 = *(undefined4 *)(root.ptr + 0x20 + lVar37 * 4);
              auVar64._4_4_ = uVar36;
              auVar64._0_4_ = uVar36;
              auVar64._8_4_ = uVar36;
              auVar64._12_4_ = uVar36;
              auVar58._8_8_ = tray.org.field_0._8_8_;
              auVar58._0_8_ = tray.org.field_0._0_8_;
              auVar16._8_8_ = tray.org.field_0._24_8_;
              auVar16._0_8_ = tray.org.field_0._16_8_;
              auVar17._8_8_ = tray.org.field_0._40_8_;
              auVar17._0_8_ = tray.org.field_0._32_8_;
              auVar57 = vsubps_avx(auVar64,auVar58);
              auVar148._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar57._0_4_;
              auVar148._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar57._4_4_;
              auVar148._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar57._8_4_;
              auVar148._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar57._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x40 + lVar37 * 4);
              auVar65._4_4_ = uVar36;
              auVar65._0_4_ = uVar36;
              auVar65._8_4_ = uVar36;
              auVar65._12_4_ = uVar36;
              auVar57 = vsubps_avx(auVar65,auVar16);
              auVar169._0_4_ = tray.rdir.field_0._16_4_ * auVar57._0_4_;
              auVar169._4_4_ = tray.rdir.field_0._20_4_ * auVar57._4_4_;
              auVar169._8_4_ = tray.rdir.field_0._24_4_ * auVar57._8_4_;
              auVar169._12_4_ = tray.rdir.field_0._28_4_ * auVar57._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x60 + lVar37 * 4);
              auVar66._4_4_ = uVar36;
              auVar66._0_4_ = uVar36;
              auVar66._8_4_ = uVar36;
              auVar66._12_4_ = uVar36;
              auVar57 = vsubps_avx(auVar66,auVar17);
              auVar184._0_4_ = tray.rdir.field_0._32_4_ * auVar57._0_4_;
              auVar184._4_4_ = tray.rdir.field_0._36_4_ * auVar57._4_4_;
              auVar184._8_4_ = tray.rdir.field_0._40_4_ * auVar57._8_4_;
              auVar184._12_4_ = tray.rdir.field_0._44_4_ * auVar57._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x30 + lVar37 * 4);
              auVar67._4_4_ = uVar36;
              auVar67._0_4_ = uVar36;
              auVar67._8_4_ = uVar36;
              auVar67._12_4_ = uVar36;
              auVar57 = vsubps_avx(auVar67,auVar58);
              auVar89._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar57._0_4_;
              auVar89._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar57._4_4_;
              auVar89._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar57._8_4_;
              auVar89._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar57._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x50 + lVar37 * 4);
              auVar68._4_4_ = uVar36;
              auVar68._0_4_ = uVar36;
              auVar68._8_4_ = uVar36;
              auVar68._12_4_ = uVar36;
              auVar57 = vsubps_avx(auVar68,auVar16);
              auVar112._0_4_ = tray.rdir.field_0._16_4_ * auVar57._0_4_;
              auVar112._4_4_ = tray.rdir.field_0._20_4_ * auVar57._4_4_;
              auVar112._8_4_ = tray.rdir.field_0._24_4_ * auVar57._8_4_;
              auVar112._12_4_ = tray.rdir.field_0._28_4_ * auVar57._12_4_;
              uVar36 = *(undefined4 *)(root.ptr + 0x70 + lVar37 * 4);
              auVar69._4_4_ = uVar36;
              auVar69._0_4_ = uVar36;
              auVar69._8_4_ = uVar36;
              auVar69._12_4_ = uVar36;
              auVar57 = vsubps_avx(auVar69,auVar17);
              auVar123._0_4_ = tray.rdir.field_0._32_4_ * auVar57._0_4_;
              auVar123._4_4_ = tray.rdir.field_0._36_4_ * auVar57._4_4_;
              auVar123._8_4_ = tray.rdir.field_0._40_4_ * auVar57._8_4_;
              auVar123._12_4_ = tray.rdir.field_0._44_4_ * auVar57._12_4_;
              auVar57 = vminps_avx(auVar148,auVar89);
              auVar132 = vminps_avx(auVar169,auVar112);
              auVar57 = vmaxps_avx(auVar57,auVar132);
              auVar132 = vminps_avx(auVar184,auVar123);
              auVar57 = vmaxps_avx(auVar57,auVar132);
              auVar70._0_4_ = auVar198._0_4_ * auVar57._0_4_;
              auVar70._4_4_ = auVar198._4_4_ * auVar57._4_4_;
              auVar70._8_4_ = auVar198._8_4_ * auVar57._8_4_;
              auVar70._12_4_ = auVar198._12_4_ * auVar57._12_4_;
              auVar57 = vmaxps_avx(auVar148,auVar89);
              auVar132 = vmaxps_avx(auVar169,auVar112);
              auVar132 = vminps_avx(auVar57,auVar132);
              auVar57 = vmaxps_avx(auVar184,auVar123);
              auVar57 = vminps_avx(auVar132,auVar57);
              auVar90._0_4_ = auVar200._0_4_ * auVar57._0_4_;
              auVar90._4_4_ = auVar200._4_4_ * auVar57._4_4_;
              auVar90._8_4_ = auVar200._8_4_ * auVar57._8_4_;
              auVar90._12_4_ = auVar200._12_4_ * auVar57._12_4_;
              auVar57 = vmaxps_avx(auVar70,(undefined1  [16])tray.tnear.field_0);
              auVar132 = vminps_avx(auVar90,(undefined1  [16])tray.tfar.field_0);
              auVar57 = vcmpps_avx(auVar57,auVar132,2);
              if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar57 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar57 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar57[0xf]) {
                auVar88 = ZEXT1664(auVar84);
                sVar41 = sVar35;
              }
              else {
                auVar57 = vblendvps_avx(auVar196._0_16_,auVar70,auVar57);
                auVar88 = ZEXT1664(auVar57);
                if (sVar35 != 8) {
                  pNVar47->ptr = sVar35;
                  pNVar47 = pNVar47 + 1;
                  *(undefined1 (*) [16])paVar46->v = auVar84;
                  paVar46 = paVar46 + 1;
                }
              }
              lVar37 = lVar37 + 1;
              auVar84 = auVar88._0_16_;
              sVar35 = sVar41;
            } while (lVar37 != 4);
            iVar32 = 4;
            if (sVar41 == 8) goto LAB_019c6074;
            auVar84 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar88._0_16_,6);
            uVar36 = vmovmskps_avx(auVar84);
            root.ptr = sVar41;
          } while ((byte)uVar44 < (byte)POPCOUNT(uVar36));
          pNVar47->ptr = sVar41;
          pNVar47 = pNVar47 + 1;
          *paVar46 = auVar88._0_16_;
          paVar46 = paVar46 + 1;
        }
        else {
          do {
            sVar35 = 0;
            for (uVar38 = uVar40; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              sVar35 = sVar35 + 1;
            }
            bVar30 = occluded1(This,bvh,root,sVar35,&pre,ray,&tray,context);
            if (bVar30) {
              terminated.field_0.i[sVar35] = -1;
            }
            uVar40 = uVar40 - 1 & uVar40;
          } while (uVar40 != 0);
          auVar84 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar84 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar84 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar84[0xf]) {
            iVar32 = 3;
          }
          else {
            auVar84._8_4_ = 0xff800000;
            auVar84._0_8_ = 0xff800000ff800000;
            auVar84._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar84,
                               (undefined1  [16])terminated.field_0);
            iVar32 = 2;
          }
          auVar196 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar198 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar200 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar88 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if (uVar44 < uVar31) goto LAB_019c5eeb;
        }
LAB_019c6074:
      } while ((iVar32 == 4) || (iVar32 == 2));
LAB_019c747f:
      auVar11 = vandps_avx(auVar11,(undefined1  [16])terminated.field_0);
      auVar87._8_4_ = 0xff800000;
      auVar87._0_8_ = 0xff800000ff800000;
      auVar87._12_4_ = 0xff800000;
      auVar11 = vmaskmovps_avx(auVar11,auVar87);
      *(undefined1 (*) [16])local_1b10 = auVar11;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }